

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_sax.hpp
# Opt level: O1

pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*>
 __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
::handle_value<bool&>
          (json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
           *this,bool *v,bool skip_callback)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar7;
  pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*>
  pVar8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  value;
  undefined1 local_55;
  undefined4 local_54;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  
  uVar1 = *(uint *)(this + 0x38);
  if (uVar1 == 0 && *(long *)(this + 0x20) == *(long *)(this + 0x30)) {
    __assert_fail("!keep_stack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/input/json_sax.hpp"
                  ,0x229,
                  "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = bool &]"
                 );
  }
  uVar6 = (ulong)uVar1 - 1;
  uVar5 = (ulong)uVar1 + 0x3e;
  if (-1 < (long)uVar6) {
    uVar5 = uVar6;
  }
  if ((*(ulong *)(*(long *)(this + 0x30) + ((long)uVar5 >> 6) * 8 + -8 +
                 (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar6 & 0x3f) &
      1) == 0) {
    uVar6 = 0;
    pbVar7 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
    goto LAB_0012bcea;
  }
  local_50.m_type = null;
  local_50.m_value.object = (object_t *)0x0;
  external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_50,*v);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_50,true);
  if (skip_callback) {
LAB_0012bb4f:
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      local_30.m_type = local_50.m_type;
      local_30.m_value.string = local_50.m_value.string;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant(&local_50,false);
      local_50.m_type = null;
      local_50.m_value.object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant(&local_30,true);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    **)this,&local_30);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_30);
      pbVar7 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 **)this;
    }
    else {
      pcVar2 = *(char **)(*(long *)(this + 0x10) + -8);
      if (pcVar2 == (char *)0x0) goto LAB_0012bcdb;
      if (*pcVar2 == '\x01') {
        lVar3 = *(long *)(this + 0x58);
        uVar1 = *(uint *)(this + 0x60);
        if (uVar1 == 0 && *(long *)(this + 0x48) == lVar3) {
          __assert_fail("!key_keep_stack.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/input/json_sax.hpp"
                        ,600,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = bool &]"
                       );
        }
        uVar6 = (ulong)uVar1 - 1;
        uVar5 = (ulong)uVar1 + 0x3e;
        if (-1 < (long)uVar6) {
          uVar5 = uVar6;
        }
        uVar5 = *(ulong *)(lVar3 + ((long)uVar5 >> 6) * 8 + -8 +
                          (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *(uint *)(this + 0x60) = uVar1 - 1;
        if (uVar1 == 0) {
          *(undefined4 *)(this + 0x60) = 0x3f;
          *(long *)(this + 0x58) = lVar3 + -8;
        }
        if ((1L << ((byte)uVar6 & 0x3f) & uVar5) == 0) goto LAB_0012bcdb;
        if (*(long *)(this + 0x70) == 0) {
          __assert_fail("object_element",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/input/json_sax.hpp"
                        ,0x261,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = bool &]"
                       );
        }
        local_40.m_type = local_50.m_type;
        local_40.m_value.string = local_50.m_value.string;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_50,false);
        local_50.m_type = null;
        local_50.m_value.object = (object_t *)0x0;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_40,true);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      **)(this + 0x70),&local_40);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_40);
        pbVar7 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   **)(this + 0x70);
      }
      else {
        if (*pcVar2 != '\x02') {
          __assert_fail("ref_stack.back()->is_array() || ref_stack.back()->is_object()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/input/json_sax.hpp"
                        ,0x24c,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = bool &]"
                       );
        }
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                     **)(pcVar2 + 8),&local_50);
        pbVar7 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + -8) + 8) + 8) + -0x10);
      }
    }
    uVar6 = CONCAT71((int7)((ulong)this >> 8),1);
  }
  else {
    local_54 = (undefined4)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3);
    local_55 = 5;
    if (*(long *)(this + 0x90) == 0) {
      std::__throw_bad_function_call();
    }
    cVar4 = (**(code **)(this + 0x98))(this + 0x80,&local_54,&local_55,&local_50);
    if (cVar4 != '\0') goto LAB_0012bb4f;
LAB_0012bcdb:
    uVar6 = 0;
    pbVar7 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_50);
LAB_0012bcea:
  pVar8._0_8_ = uVar6 & 0xffffffff;
  pVar8.second = pbVar7;
  return pVar8;
}

Assistant:

std::pair<bool, BasicJsonType*> handle_value(Value&& v, const bool skip_callback = false)
    {
        JSON_ASSERT(!keep_stack.empty());

        // do not handle this value if we know it would be added to a discarded
        // container
        if (!keep_stack.back())
        {
            return {false, nullptr};
        }

        // create value
        auto value = BasicJsonType(std::forward<Value>(v));

        // check callback
        const bool keep = skip_callback || callback(static_cast<int>(ref_stack.size()), parse_event_t::value, value);

        // do not handle this value if we just learnt it shall be discarded
        if (!keep)
        {
            return {false, nullptr};
        }

        if (ref_stack.empty())
        {
            root = std::move(value);
            return {true, &root};
        }

        // skip this value if we already decided to skip the parent
        // (https://github.com/nlohmann/json/issues/971#issuecomment-413678360)
        if (!ref_stack.back())
        {
            return {false, nullptr};
        }

        // we now only expect arrays and objects
        JSON_ASSERT(ref_stack.back()->is_array() || ref_stack.back()->is_object());

        // array
        if (ref_stack.back()->is_array())
        {
            ref_stack.back()->m_value.array->emplace_back(std::move(value));
            return {true, &(ref_stack.back()->m_value.array->back())};
        }

        // object
        JSON_ASSERT(ref_stack.back()->is_object());
        // check if we should store an element for the current key
        JSON_ASSERT(!key_keep_stack.empty());
        const bool store_element = key_keep_stack.back();
        key_keep_stack.pop_back();

        if (!store_element)
        {
            return {false, nullptr};
        }

        JSON_ASSERT(object_element);
        *object_element = std::move(value);
        return {true, object_element};
    }